

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

Result * CoreML::validateInt8Requirements
                   (Result *__return_storage_ptr__,WeightParams *weights,string *layerType,
                   string *layerName)

{
  bool bVar1;
  WeightParamType WVar2;
  int iVar3;
  QuantizationParams *pQVar4;
  uint64_t uVar5;
  LinearQuantizationParams *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *layerName_local;
  string *layerType_local;
  WeightParams *weights_local;
  
  local_28 = layerName;
  layerName_local = layerType;
  layerType_local = (string *)weights;
  weights_local = (WeightParams *)__return_storage_ptr__;
  WVar2 = valueType(weights);
  if (WVar2 == QINT) {
    pQVar4 = Specification::WeightParams::quantization((WeightParams *)layerType_local);
    uVar5 = Specification::QuantizationParams::numberofbits(pQVar4);
    if (uVar5 == 8) {
      pQVar4 = Specification::WeightParams::quantization((WeightParams *)layerType_local);
      bVar1 = Specification::QuantizationParams::has_linearquantization(pQVar4);
      if (bVar1) {
        pQVar4 = Specification::WeightParams::quantization((WeightParams *)layerType_local);
        pLVar6 = Specification::QuantizationParams::linearquantization(pQVar4);
        iVar3 = Specification::LinearQuantizationParams::scale_size(pLVar6);
        if (iVar3 == 1) {
          pQVar4 = Specification::WeightParams::quantization((WeightParams *)layerType_local);
          pLVar6 = Specification::QuantizationParams::linearquantization(pQVar4);
          iVar3 = Specification::LinearQuantizationParams::bias_size(pLVar6);
          if (iVar3 == 0) {
            Result::Result(__return_storage_ptr__);
          }
          else {
            std::operator+(&local_2b8,"Layer \'",local_28);
            std::operator+(&local_298,&local_2b8,"\' of type \'");
            std::operator+(&local_278,&local_298,layerName_local);
            std::operator+(&local_258,&local_278,
                           " :                           Linear quantization bias must be empty when flag \'int8DynamicQuantize\' is set to true."
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_258);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
          }
        }
        else {
          std::operator+(&local_238,"Layer \'",local_28);
          std::operator+(&local_218,&local_238,"\' of type \'");
          std::operator+(&local_1f8,&local_218,layerName_local);
          std::operator+(&local_1d8,&local_1f8,
                         " :                           Linear quantization scale must be size 1 when flag \'int8DynamicQuantize\' is set to true."
                        );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
        }
      }
      else {
        std::operator+(&local_1b8,"Layer \'",local_28);
        std::operator+(&local_198,&local_1b8,"\' of type \'");
        std::operator+(&local_178,&local_198,layerName_local);
        std::operator+(&local_158,&local_178,
                       " :                           Linear quantization must be used when flag \'int8DynamicQuantize\' is set to true."
                      );
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
    }
    else {
      std::operator+(&local_138,"Layer \'",local_28);
      std::operator+(&local_118,&local_138,"\' of type \'");
      std::operator+(&local_f8,&local_118,layerName_local);
      std::operator+(&local_d8,&local_f8,
                     " :                           Number of bits must equal 8 when flag \'int8DynamicQuantize\' is set to true."
                    );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
    }
  }
  else {
    std::operator+(&local_a8,"Layer \'",local_28);
    std::operator+(&local_88,&local_a8,"\' of type \'");
    std::operator+(&local_68,&local_88,layerName_local);
    std::operator+(&local_48,&local_68,
                   " :                            when flag \'int8DynamicQuantize\' is set to true, weights must be stored in the int8 format."
                  );
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInt8Requirements(const Specification::WeightParams& weights,
                                           const std::string &layerType,
                                           const std::string &layerName) {
        if (CoreML::valueType(weights) != CoreML::QINT) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " :  \
                          when flag 'int8DynamicQuantize' is set to true, weights must be stored in the int8 format.");
        }

        if (weights.quantization().numberofbits() != 8) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Number of bits must equal 8 when flag 'int8DynamicQuantize' is set to true.");
        } else if (!weights.quantization().has_linearquantization()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization must be used when flag 'int8DynamicQuantize' is set to true.");
        } else if (weights.quantization().linearquantization().scale_size() != 1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization scale must be size 1 when flag 'int8DynamicQuantize' is set to true.");
        } else if (weights.quantization().linearquantization().bias_size() != 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer '" + layerName + "' of type '" + layerType + " : \
                          Linear quantization bias must be empty when flag 'int8DynamicQuantize' is set to true.");
        } else {
            return Result();
        }

    }